

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Metaiterators.hpp
# Opt level: O2

_ElementType __thiscall
Lib::
CatIterator<Lib::SingletonIterator<Indexing::SubstitutionTree<Indexing::TermWithValue<Kernel::Literal_*>_>::Node_**>,_Lib::IterTraits<Lib::VirtualIterator<Indexing::SubstitutionTree<Indexing::TermWithValue<Kernel::Literal_*>_>::Node_**>_>_>
::next(CatIterator<Lib::SingletonIterator<Indexing::SubstitutionTree<Indexing::TermWithValue<Kernel::Literal_*>_>::Node_**>,_Lib::IterTraits<Lib::VirtualIterator<Indexing::SubstitutionTree<Indexing::TermWithValue<Kernel::Literal_*>_>::Node_**>_>_>
       *this)

{
  int iVar1;
  undefined4 extraout_var;
  
  hasNext(this);
  if (this->_first == true) {
    (this->_it1)._finished = true;
    return (this->_it1)._el;
  }
  iVar1 = (*((this->_it2)._iter._core)->_vptr_IteratorCore[3])();
  return (_ElementType)CONCAT44(extraout_var,iVar1);
}

Assistant:

OWN_ELEMENT_TYPE next()
  {
    ALWAYS(hasNext())
    if(_first) {
      //_it1 contains the next value, as hasNext must have
      //been called before. (It would have updated the
      //_first value otherwise.)
      return _it1.next();
    }
    return  _it2.next();
  }